

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::IRContext::ProcessReachableCallTree(IRContext *this,ProcessFunction *pfn)

{
  bool bVar1;
  Op OVar2;
  uint32_t uVar3;
  Function *pFVar4;
  uint32_t local_d8;
  uint32_t local_d4;
  uint32_t id;
  uint32_t lastOperand;
  Instruction *a;
  iterator __end2_1;
  iterator __begin2_1;
  IteratorRange<spvtools::opt::InstructionList::iterator> *__range2_1;
  Instruction *local_98;
  Instruction *e;
  iterator __end2;
  iterator __begin2;
  IteratorRange<spvtools::opt::InstructionList::iterator> *__range2;
  queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> roots;
  ProcessFunction *pfn_local;
  IRContext *this_local;
  
  roots.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)pfn;
  std::queue<unsigned_int,std::deque<unsigned_int,std::allocator<unsigned_int>>>::
  queue<std::deque<unsigned_int,std::allocator<unsigned_int>>,void>
            ((queue<unsigned_int,std::deque<unsigned_int,std::allocator<unsigned_int>>> *)&__range2)
  ;
  module(this);
  Module::entry_points((Module *)&__begin2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::begin
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&__end2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::end
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&e);
  while (bVar1 = utils::operator!=(&__end2.super_iterator,
                                   (iterator_template<spvtools::opt::Instruction> *)&e), bVar1) {
    local_98 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator*(&__end2.super_iterator);
    __range2_1._4_4_ = opt::Instruction::GetSingleWordInOperand(local_98,1);
    std::queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::push
              ((queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &__range2,(value_type *)((long)&__range2_1 + 4));
    InstructionList::iterator::operator++(&__end2);
  }
  annotations((IRContext *)&__begin2_1);
  IteratorRange<spvtools::opt::InstructionList::iterator>::begin
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&__end2_1);
  IteratorRange<spvtools::opt::InstructionList::iterator>::end
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&a);
  while (bVar1 = utils::operator!=(&__end2_1.super_iterator,
                                   (iterator_template<spvtools::opt::Instruction> *)&a), bVar1) {
    _id = utils::IntrusiveList<spvtools::opt::Instruction>::
          iterator_template<spvtools::opt::Instruction>::operator*(&__end2_1.super_iterator);
    OVar2 = opt::Instruction::opcode(_id);
    if ((OVar2 == OpDecorate) &&
       (uVar3 = opt::Instruction::GetSingleWordOperand(_id,1), uVar3 == 0x29)) {
      local_d4 = opt::Instruction::NumOperands(_id);
      local_d4 = local_d4 - 1;
      uVar3 = opt::Instruction::GetSingleWordOperand(_id,local_d4);
      if (uVar3 == 0) {
        local_d8 = opt::Instruction::GetSingleWordOperand(_id,0);
        pFVar4 = GetFunction(this,local_d8);
        if (pFVar4 != (Function *)0x0) {
          std::queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::push
                    ((queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>
                      *)&__range2,&local_d8);
        }
      }
    }
    InstructionList::iterator::operator++(&__end2_1);
  }
  bVar1 = ProcessCallTreeFromRoots
                    (this,(ProcessFunction *)
                          roots.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Deque_impl_data._M_finish._M_node,
                     (queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>
                      *)&__range2);
  std::queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::~queue
            ((queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
             &__range2);
  return bVar1;
}

Assistant:

bool IRContext::ProcessReachableCallTree(ProcessFunction& pfn) {
  std::queue<uint32_t> roots;

  // Add all entry points since they can be reached from outside the module.
  for (auto& e : module()->entry_points())
    roots.push(e.GetSingleWordInOperand(kEntryPointFunctionIdInIdx));

  // Add all exported functions since they can be reached from outside the
  // module.
  for (auto& a : annotations()) {
    // TODO: Handle group decorations as well.  Currently not generate by any
    // front-end, but could be coming.
    if (a.opcode() == spv::Op::OpDecorate) {
      if (spv::Decoration(a.GetSingleWordOperand(1)) ==
          spv::Decoration::LinkageAttributes) {
        uint32_t lastOperand = a.NumOperands() - 1;
        if (spv::LinkageType(a.GetSingleWordOperand(lastOperand)) ==
            spv::LinkageType::Export) {
          uint32_t id = a.GetSingleWordOperand(0);
          if (GetFunction(id)) {
            roots.push(id);
          }
        }
      }
    }
  }

  return ProcessCallTreeFromRoots(pfn, &roots);
}